

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KinDynComputations.cpp
# Opt level: O3

void __thiscall
iDynTree::KinDynComputations::KinDynComputationsPrivateAttributes::
processOnLeftSideBodyFixedAvgVelocityJacobian
          (KinDynComputationsPrivateAttributes *this,MatrixView<double> *jac)

{
  double *pdVar1;
  long cols;
  long lVar2;
  long lVar3;
  Index row_1;
  Rotation *pRVar4;
  Transform *this_00;
  long lVar5;
  double *pdVar6;
  pointer peVar7;
  Index dstCols;
  ActualDstType actualDst;
  element_type *peVar8;
  long lVar9;
  double *pdVar10;
  Index col;
  long lVar11;
  long lVar12;
  pointer peVar13;
  Transform newOutputFrame_X_oldOutputFrame;
  Matrix6x6 newOutputFrame_X_oldOutputFrame_;
  PlainObjectBase<Eigen::Matrix<double,_6,__1,_0,_6,__1>_> local_1d8 [2];
  element_type *local_1b8;
  Transform local_1b0 [96];
  Transform local_150 [40];
  double local_128 [31];
  
  iDynTree::Transform::Transform(local_1b0);
  if (this->m_frameVelRepr != BODY_FIXED_REPRESENTATION) {
    if (this->m_frameVelRepr == MIXED_REPRESENTATION) {
      iDynTree::FreeFloatingPos::worldBasePos();
      pRVar4 = (Rotation *)iDynTree::Transform::getRotation();
      iDynTree::Position::Zero();
      this_00 = local_150;
      iDynTree::Transform::Transform(this_00,pRVar4,(Position *)local_1d8);
    }
    else {
      this_00 = (Transform *)iDynTree::FreeFloatingPos::worldBasePos();
    }
    iDynTree::Transform::operator=(local_1b0,this_00);
    iDynTree::Transform::asAdjointTransform();
    cols = jac->m_cols;
    lVar2 = jac->m_rows;
    lVar12 = 1;
    lVar3 = lVar2;
    if (jac->m_storageOrder != ColumnMajor) {
      lVar12 = cols;
      lVar3 = 1;
    }
    peVar13 = jac->m_storage;
    local_1d8[0].m_storage.m_data = (element_type *)0x0;
    local_1d8[0].m_storage.m_cols = 0;
    if (cols != 0) {
      Eigen::PlainObjectBase<Eigen::Matrix<double,_6,_-1,_0,_6,_-1>_>::resize(local_1d8,6,cols);
      lVar5 = cols;
      if (local_1d8[0].m_storage.m_cols != cols) {
        Eigen::PlainObjectBase<Eigen::Matrix<double,_6,_-1,_0,_6,_-1>_>::resize(local_1d8,6,cols);
        lVar5 = local_1d8[0].m_storage.m_cols;
      }
      if (0 < lVar5) {
        lVar11 = 0;
        local_1b8 = local_1d8[0].m_storage.m_data;
        pdVar6 = local_1d8[0].m_storage.m_data;
        do {
          pdVar1 = peVar13 + lVar11 * lVar3;
          pdVar10 = local_128;
          lVar9 = 0;
          do {
            pdVar6[lVar9] =
                 pdVar1[lVar12 * 5] * *pdVar10 + pdVar1[lVar12 * 4] * pdVar10[-1] +
                 pdVar1[lVar12 * 3] * pdVar10[-2] +
                 pdVar1[lVar12 * 2] * pdVar10[-3] + pdVar1[lVar12] * pdVar10[-4] +
                 *pdVar1 * pdVar10[-5];
            lVar9 = lVar9 + 1;
            pdVar10 = pdVar10 + 6;
          } while (lVar9 != 6);
          lVar11 = lVar11 + 1;
          pdVar6 = pdVar6 + 6;
        } while (lVar11 != lVar5);
      }
    }
    if (0 < lVar2) {
      lVar5 = 0;
      pdVar6 = local_1d8[0].m_storage.m_data;
      do {
        peVar7 = peVar13;
        peVar8 = pdVar6;
        lVar11 = cols;
        if (0 < cols) {
          do {
            *peVar7 = *peVar8;
            peVar8 = peVar8 + 6;
            peVar7 = peVar7 + lVar3;
            lVar11 = lVar11 + -1;
          } while (lVar11 != 0);
        }
        lVar5 = lVar5 + 1;
        pdVar6 = pdVar6 + 1;
        peVar13 = peVar13 + lVar12;
      } while (lVar5 != lVar2);
    }
    free(local_1d8[0].m_storage.m_data);
  }
  return;
}

Assistant:

void KinDynComputations::KinDynComputationsPrivateAttributes::processOnLeftSideBodyFixedAvgVelocityJacobian(
      MatrixView<double> jac)
{
    assert(jac.rows() == 6);

    Transform newOutputFrame_X_oldOutputFrame;
    if (m_frameVelRepr == BODY_FIXED_REPRESENTATION)
    {
        return;
    }
    else if (m_frameVelRepr == MIXED_REPRESENTATION)
    {
        Transform & world_X_base = m_pos.worldBasePos();
        newOutputFrame_X_oldOutputFrame = Transform(world_X_base.getRotation(),Position::Zero());
    }
    else
    {
        assert(m_frameVelRepr == INERTIAL_FIXED_REPRESENTATION);
        newOutputFrame_X_oldOutputFrame = m_pos.worldBasePos();
    }

    Matrix6x6 newOutputFrame_X_oldOutputFrame_ = newOutputFrame_X_oldOutputFrame.asAdjointTransform();

    toEigen(jac) = toEigen(newOutputFrame_X_oldOutputFrame_)*toEigen(jac);
}